

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedStorage.h
# Opt level: O0

void __thiscall
Eigen::internal::CompressedStorage<double,_int>::resize
          (CompressedStorage<double,_int> *this,size_t size,double reserveSizeFactor)

{
  ulong uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double reserveSizeFactor_local;
  size_t size_local;
  CompressedStorage<double,_int> *this_local;
  
  if (this->m_allocatedSize < size) {
    auVar3._8_4_ = (int)(size >> 0x20);
    auVar3._0_8_ = size;
    auVar3._12_4_ = 0x45300000;
    dVar2 = reserveSizeFactor *
            ((auVar3._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)size) - 4503599627370496.0));
    uVar1 = (ulong)dVar2;
    reallocate(this,size + (uVar1 | (long)(dVar2 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f));
  }
  this->m_size = size;
  return;
}

Assistant:

void resize(size_t size, double reserveSizeFactor = 0)
    {
      if (m_allocatedSize<size)
        reallocate(size + size_t(reserveSizeFactor*double(size)));
      m_size = size;
    }